

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool __thiscall
cmStringCommand::HandleRandomCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  undefined1 *puVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  vector<char,_std::allocator<char>_> result;
  string alphabet;
  char cmStringCommandDefaultAlphabet [63];
  uint local_d0;
  char local_c9;
  string local_c8;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  double local_88;
  double dStack_80;
  string local_78;
  char acStack_58 [40];
  
  uVar8 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if ((uVar8 < 6) && ((0x2bUL >> (uVar8 & 0x3f) & 1) != 0)) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"sub-command RANDOM requires at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  builtin_strncpy(acStack_58,"UIOPASDFGHJKLZXCVBNM0123456789",0x1f);
  local_78.field_2._M_local_buf[0] = 'j';
  local_78.field_2._M_local_buf[1] = 'k';
  local_78.field_2._M_local_buf[2] = 'l';
  local_78.field_2._M_local_buf[3] = 'z';
  local_78.field_2._M_local_buf[4] = 'x';
  local_78.field_2._M_local_buf[5] = 'c';
  local_78.field_2._M_local_buf[6] = 'v';
  local_78.field_2._M_local_buf[7] = 'b';
  local_78.field_2._M_local_buf[8] = 'n';
  local_78.field_2._M_local_buf[9] = 'm';
  local_78.field_2._M_local_buf[10] = 'Q';
  local_78.field_2._M_local_buf[0xb] = 'W';
  local_78.field_2._M_local_buf[0xc] = 'E';
  local_78.field_2._M_local_buf[0xd] = 'R';
  local_78.field_2._M_local_buf[0xe] = 'T';
  local_78.field_2._M_local_buf[0xf] = 'Y';
  local_78._M_dataplus._M_p = (pointer)0x6975797472657771;
  local_78._M_string_length._0_1_ = 'o';
  local_78._M_string_length._1_1_ = 'p';
  local_78._M_string_length._2_1_ = 'a';
  local_78._M_string_length._3_1_ = 's';
  local_78._M_string_length._4_1_ = 'd';
  local_78._M_string_length._5_1_ = 'f';
  local_78._M_string_length._6_1_ = 'g';
  local_78._M_string_length._7_1_ = 'h';
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = 0;
  local_d0 = 0;
  iVar4 = 5;
  if (uVar8 < 4) {
    bVar5 = false;
  }
  else {
    local_d0 = 0;
    bVar5 = false;
    if (1 < uVar8 - 2) {
      local_88 = (double)CONCAT44(local_88._4_4_,5);
      uVar7 = 1;
      bVar5 = false;
      local_d0 = 0;
      do {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar7));
        if (iVar4 == 0) {
          uVar7 = uVar7 + 1;
          iVar4 = atoi((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p);
          local_88 = (double)CONCAT44(local_88._4_4_,iVar4);
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar7));
          if (iVar4 == 0) {
            uVar7 = uVar7 + 1;
            std::__cxx11::string::_M_assign((string *)&local_a8);
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar7));
            if (iVar4 == 0) {
              uVar7 = uVar7 + 1;
              local_d0 = atoi((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p);
              bVar5 = true;
            }
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar8 - 2);
      iVar4 = local_88._0_4_;
    }
  }
  if (local_a0 == 0) {
    strlen((char *)&local_78);
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,(ulong)&local_78);
  }
  lVar3 = local_a0;
  if (local_a0 == 0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"sub-command RANDOM invoked with bad alphabet.","");
    cmCommand::SetError(&this->super_cmCommand,&local_c8);
  }
  else {
    if (0 < iVar4) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_c8._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_allocated_capacity = 0;
      if ((~HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::seeded & 1) != 0 || bVar5) {
        HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
        ::seeded = 1;
        if (!bVar5) {
          local_d0 = cmSystemTools::RandomSeed();
        }
        srand(local_d0);
      }
      puVar2 = local_a8;
      auVar9._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar9._0_8_ = lVar3;
      auVar9._12_4_ = 0x45300000;
      dStack_80 = auVar9._8_8_ - 1.9342813113834067e+25;
      local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
      iVar6 = 1;
      if (1 < iVar4) {
        iVar6 = iVar4;
      }
      do {
        iVar4 = rand();
        if (local_c8._M_string_length == local_c8.field_2._M_allocated_capacity) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_c8,
                     (iterator)local_c8._M_string_length,
                     puVar2 + (int)((double)iVar4 * local_88 * 4.656612873077393e-10));
        }
        else {
          *(undefined1 *)local_c8._M_string_length =
               puVar2[(int)((double)iVar4 * local_88 * 4.656612873077393e-10)];
          local_c8._M_string_length = local_c8._M_string_length + 1;
        }
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      local_c9 = '\0';
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                ((vector<char,_std::allocator<char>_> *)&local_c8,&local_c9);
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,pbVar1 + -1,local_c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_c8._M_dataplus._M_p,
                        local_c8.field_2._M_allocated_capacity - (long)local_c8._M_dataplus._M_p);
      }
      bVar5 = true;
      goto LAB_001e3633;
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"sub-command RANDOM invoked with bad length.","");
    cmCommand::SetError(&this->super_cmCommand,&local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1));
  }
  bVar5 = false;
LAB_001e3633:
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  return bVar5;
}

Assistant:

bool cmStringCommand::HandleRandomCommand(std::vector<std::string> const& args)
{
  if (args.size() < 2 || args.size() == 3 || args.size() == 5) {
    this->SetError("sub-command RANDOM requires at least one argument.");
    return false;
  }

  static bool seeded = false;
  bool force_seed = false;
  unsigned int seed = 0;
  int length = 5;
  const char cmStringCommandDefaultAlphabet[] = "qwertyuiopasdfghjklzxcvbnm"
                                                "QWERTYUIOPASDFGHJKLZXCVBNM"
                                                "0123456789";
  std::string alphabet;

  if (args.size() > 3) {
    size_t i = 1;
    size_t stopAt = args.size() - 2;

    for (; i < stopAt; ++i) {
      if (args[i] == "LENGTH") {
        ++i;
        length = atoi(args[i].c_str());
      } else if (args[i] == "ALPHABET") {
        ++i;
        alphabet = args[i];
      } else if (args[i] == "RANDOM_SEED") {
        ++i;
        seed = static_cast<unsigned int>(atoi(args[i].c_str()));
        force_seed = true;
      }
    }
  }
  if (alphabet.empty()) {
    alphabet = cmStringCommandDefaultAlphabet;
  }

  double sizeofAlphabet = static_cast<double>(alphabet.size());
  if (sizeofAlphabet < 1) {
    this->SetError("sub-command RANDOM invoked with bad alphabet.");
    return false;
  }
  if (length < 1) {
    this->SetError("sub-command RANDOM invoked with bad length.");
    return false;
  }
  const std::string& variableName = args.back();

  std::vector<char> result;

  if (!seeded || force_seed) {
    seeded = true;
    srand(force_seed ? seed : cmSystemTools::RandomSeed());
  }

  const char* alphaPtr = alphabet.c_str();
  for (int cc = 0; cc < length; cc++) {
    int idx = static_cast<int>(sizeofAlphabet * rand() / (RAND_MAX + 1.0));
    result.push_back(*(alphaPtr + idx));
  }
  result.push_back(0);

  this->Makefile->AddDefinition(variableName, result.data());
  return true;
}